

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::insert(CBString *this,int pos,CBString *b,uchar cfill)

{
  int iVar1;
  CBStringException *this_00;
  const_bstring local_90;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  CBStringException bstr__cppwrapper_exception;
  uchar cfill_local;
  CBString *b_local;
  int pos_local;
  CBString *this_local;
  
  local_90 = (const_bstring)0x0;
  if (b != (CBString *)0x0) {
    local_90 = &b->super_tagbstring;
  }
  bstr__cppwrapper_exception.msg.field_2._M_local_buf[0xf] = cfill;
  iVar1 = binsert(&this->super_tagbstring,pos,local_90,cfill);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"CBString::Failure in insert",&local_71);
    CBStringException::CBStringException((CBStringException *)local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_50);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBString::insert (int pos, const CBString& b, unsigned char cfill) {
	if (BSTR_ERR == binsert (this, pos, (bstring) &b, cfill)) {
		bstringThrow ("Failure in insert");
	}
}